

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEEE754PluginTest.cpp
# Opt level: O2

void __thiscall
TEST_FE_with_Plugin_should_fail_when_FE_INEXACT_is_set_and_enabled_Test::testBody
          (TEST_FE_with_Plugin_should_fail_when_FE_INEXACT_is_set_and_enabled_Test *this)

{
  TestTestingFixture *this_00;
  SimpleString local_20;
  
  IEEE754ExceptionsPlugin::enableInexact();
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupFE_with_Plugin).fixture;
  TestTestingFixture::setTestFunction(this_00,set_inexact_c);
  TestTestingFixture::runAllTests(this_00);
  SimpleString::SimpleString(&local_20,"IEEE754_CHECK_CLEAR(FE_INEXACT) failed");
  TestTestingFixture::assertPrintContains(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  return;
}

Assistant:

TEST(FE_with_Plugin, should_fail_when_FE_INEXACT_is_set_and_enabled)
{
    IEEE754ExceptionsPlugin::enableInexact();
    fixture.setTestFunction(set_inexact_c);
    fixture.runAllTests();
    fixture.assertPrintContains("IEEE754_CHECK_CLEAR(FE_INEXACT) failed");
}